

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CodeVerifyNamedSchema(Parse *pParse,char *zDb)

{
  byte bVar1;
  byte bVar2;
  sqlite3 *psVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  psVar3 = pParse->db;
  iVar4 = psVar3->nDb;
  if (0 < iVar4) {
    lVar6 = 0;
    do {
      if (psVar3->aDb[lVar6].pBt != (Btree *)0x0) {
        if (zDb != (char *)0x0) {
          lVar5 = 0;
          do {
            bVar1 = zDb[lVar5];
            bVar2 = psVar3->aDb[lVar6].zDbSName[lVar5];
            if (bVar1 == bVar2) {
              if ((ulong)bVar1 == 0) break;
            }
            else if (""[bVar1] != ""[bVar2]) goto LAB_0017596c;
            lVar5 = lVar5 + 1;
          } while( true );
        }
        sqlite3CodeVerifySchema(pParse,(int)lVar6);
        iVar4 = psVar3->nDb;
      }
LAB_0017596c:
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar4);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeVerifyNamedSchema(Parse *pParse, const char *zDb){
  sqlite3 *db = pParse->db;
  int i;
  for(i=0; i<db->nDb; i++){
    Db *pDb = &db->aDb[i];
    if( pDb->pBt && (!zDb || 0==sqlite3StrICmp(zDb, pDb->zDbSName)) ){
      sqlite3CodeVerifySchema(pParse, i);
    }
  }
}